

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O0

void __thiscall cppjieba::SegmentBase::SegmentBase(SegmentBase *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  string *in_stack_00000350;
  SegmentBase *in_stack_00000358;
  Logger *this_00;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  Logger *in_stack_fffffffffffffeb0;
  allocator<char> local_29;
  string local_28 [40];
  
  *in_RDI = &PTR__SegmentBase_0016ed00;
  this_00 = (Logger *)(in_RDI + 1);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x13b9f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  bVar1 = ResetSeparators(in_stack_00000358,in_stack_00000350);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    limonp::Logger::Logger
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c);
    poVar2 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffffe40);
    poVar2 = std::operator<<(poVar2,"exp: [ResetSeparators(SPECIAL_SEPARATORS)");
    std::operator<<(poVar2,"] false. ");
    limonp::Logger::~Logger(this_00);
  }
  return;
}

Assistant:

SegmentBase() {
    XCHECK(ResetSeparators(SPECIAL_SEPARATORS));
  }